

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_controller.cpp
# Opt level: O1

void __thiscall r_exec::InputLessPGMController::signal_input_less_pgm(InputLessPGMController *this)

{
  mutex *__mutex;
  InputLessPGMOverlay *this_00;
  View *v;
  int iVar1;
  Group *this_01;
  _Mem *this_02;
  TimeJob *j;
  long lVar2;
  float fVar3;
  float fVar4;
  
  __mutex = &(this->super__PGMController).super_OController.super_Controller.m_reductionMutex;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  if ((this->super__PGMController).super_OController.overlays.used_cell_count != 0) {
    this_00 = (InputLessPGMOverlay *)
              (this->super__PGMController).super_OController.overlays.cells.
              super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
              ._M_impl.super__Vector_impl_data._M_start
              [(this->super__PGMController).super_OController.overlays.used_cells_head].data.object;
    InputLessPGMOverlay::inject_productions(this_00);
    (*(this_00->super_Overlay).super__Object._vptr__Object[2])(this_00);
    if ((((this->super__PGMController).run_once == false) &&
        ((this->super__PGMController).super_OController.super_Controller.invalidated == 0)) &&
       ((this->super__PGMController).super_OController.super_Controller.activated == 1)) {
      this_01 = r_exec::View::get_host
                          ((View *)(this->super__PGMController).super_OController.super_Controller.
                                   view);
      iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_hostMutex);
      if (iVar1 != 0) {
        std::__throw_system_error(iVar1);
      }
      fVar3 = Group::get_c_act(this_01);
      fVar4 = Group::get_c_act_thr(this_01);
      if (fVar4 < fVar3) {
        fVar3 = Group::get_c_sln(this_01);
        fVar4 = Group::get_c_sln_thr(this_01);
        if (fVar4 < fVar3) {
          this_02 = (_Mem *)r_code::Mem::Get();
          j = (TimeJob *)operator_new(0x28);
          v = (View *)(this->super__PGMController).super_OController.super_Controller.view;
          lVar2 = (*Now)();
          InputLessPGMSignalingJob::InputLessPGMSignalingJob
                    ((InputLessPGMSignalingJob *)j,v,
                     lVar2 + (this->super__PGMController).super_OController.super_Controller.tsc);
          _Mem::pushTimeJob(this_02,j);
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)&this->m_hostMutex);
    }
  }
  if ((this->super__PGMController).run_once == true) {
    (*(this->super__PGMController).super_OController.super_Controller.super__Object._vptr__Object[3]
    )(this);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void InputLessPGMController::signal_input_less_pgm()
{
    std::lock_guard<std::mutex> reductionGuard(m_reductionMutex);

    if (overlays.size()) {
        InputLessPGMOverlay *overlay = (InputLessPGMOverlay *)overlays.front();
        overlay->inject_productions();
        overlay->reset();

        if (!run_once) {
            if (is_alive()) {
                Group *host = getView()->get_host();
                std::lock_guard<std::mutex> guard(m_hostMutex);

                if (host->get_c_act() > host->get_c_act_thr() && // c-active group.
                    host->get_c_sln() > host->get_c_sln_thr()) { // c-salient group.
                    _Mem::Get()->pushTimeJob(new InputLessPGMSignalingJob((r_exec::View*)view, Now() + tsc));
                }
            }
        }
    }

    if (run_once) {
        invalidate();
    }
}